

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

callbacks __thiscall
pstore::exchange::import_ns::callbacks::
make<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::exchange::import_ns::string_mapping_const*,pstore::gsl::not_null<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>>
          (callbacks *this,not_null<pstore::database_*> db,string_mapping *args,
          not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
          args_1)

{
  context *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  tVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer __p;
  callbacks cVar4;
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  __uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_60;
  _Head_base<0UL,_pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>_*,_false>
  local_58;
  shared_ptr<pstore::exchange::import_ns::context> local_50;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> local_40;
  not_null<pstore::exchange::import_ns::context_*> local_38;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00233cd0;
  this_00 = (context *)(p_Var1 + 1);
  context::context(this_00,db);
  local_50.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  local_50.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  tVar2.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )operator_new(0x20);
  local_38.ptr_ = this_00;
  gsl::not_null<pstore::exchange::import_ns::context_*>::ensure_invariant(&local_38);
  local_40.ptr_ = args;
  gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>::ensure_invariant(&local_40);
  *(context **)
   ((long)tVar2.
          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl + 8) =
       local_38.ptr_;
  *(undefined ***)
   tVar2.
   super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
   .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       &PTR__rule_00238050;
  *(string_mapping **)
   ((long)tVar2.
          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl + 0x10) =
       local_40.ptr_;
  *(vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> **)
   ((long)tVar2.
          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl + 0x18) =
       args_1.ptr_;
  local_58._M_head_impl =
       (fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup> *)
       0x0;
  local_60._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )(tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          )tVar2.
           super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
           .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl;
  callbacks(this,&local_50,
            (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             *)&local_60);
  if ((_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
       )local_60._M_t.
        super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl !=
      (rule *)0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>.
                          _M_head_impl + 8))();
  }
  local_60._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )(_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          )0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_std::default_delete<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_std::default_delete<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>_>_>
                 *)&local_58);
  _Var3._M_pi = extraout_RDX;
  if (local_50.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  cVar4.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  cVar4.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (callbacks)
         cVar4.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }